

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O2

void Cmd_listsublights(FCommandLine *argv,APlayerPawn *who,int key)

{
  FLightNode **ppFVar1;
  ulong uVar2;
  int i;
  ulong uVar3;
  
  for (uVar3 = 0; (long)uVar3 < (long)numsubsectors; uVar3 = uVar3 + 1) {
    uVar2 = 0;
    for (ppFVar1 = &subsectors[uVar3].lighthead; *ppFVar1 != (FLightNode *)0x0;
        ppFVar1 = &(*ppFVar1)->nextLight) {
      uVar2 = (ulong)((int)uVar2 + 1);
    }
    Printf(5,"Subsector %d - %d lights\n",uVar3 & 0xffffffff,uVar2);
  }
  return;
}

Assistant:

CCMD(listsublights)
{
	for(int i=0;i<numsubsectors;i++)
	{
		subsector_t *sub = &subsectors[i];
		int lights = 0;

		FLightNode * node = sub->lighthead;
		while (node != NULL)
		{
			lights++;
			node = node->nextLight;
		}

		Printf(PRINT_LOG, "Subsector %d - %d lights\n", i, lights);
	}
}